

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O3

UStringTrieResult __thiscall icu_63::UCharsTrie::nextImpl(UCharsTrie *this,UChar *pos,int32_t uchar)

{
  UChar UVar1;
  uint length;
  UStringTrieResult UVar2;
  uint uVar3;
  UChar *pos_00;
  
  UVar1 = *pos;
  pos_00 = pos + 1;
  length = (uint)(ushort)UVar1;
  if (0x2f < (ushort)UVar1) {
    length = (ushort)UVar1 & 0x3f;
    uVar3 = (uint)(ushort)UVar1;
    do {
      if (uVar3 < 0x40) {
        if ((uint)(ushort)*pos_00 == uchar) {
          this->remainingMatchLength_ = uVar3 - 0x31;
          this->pos_ = pos_00 + 1;
          if (uVar3 != 0x30) {
            return USTRINGTRIE_NO_VALUE;
          }
          UVar1 = pos_00[1];
          if ((ushort)UVar1 < 0x40) {
            return USTRINGTRIE_NO_VALUE;
          }
          return (ushort)UVar1 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        }
LAB_0032e6e2:
        this->pos_ = (char16_t *)0x0;
        return USTRINGTRIE_NO_MATCH;
      }
      if (0x7fff < uVar3) goto LAB_0032e6e2;
      if (0x403f < uVar3) {
        if (uVar3 < 0x7fc0) {
          pos_00 = pos_00 + 1;
        }
        else {
          pos_00 = pos_00 + 2;
        }
      }
      uVar3 = length;
    } while (0x2f < length);
  }
  UVar2 = branchNext(this,pos_00,length,uchar);
  return UVar2;
}

Assistant:

UStringTrieResult
UCharsTrie::nextImpl(const UChar *pos, int32_t uchar) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, uchar);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 units.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(uchar==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching units.
            break;
        } else {
            // Skip intermediate value.
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}